

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O0

offset_t __thiscall ImportedFuncWrapper::getFieldRVA(ImportedFuncWrapper *this,FieldID fId)

{
  bufsize_t bVar1;
  offset_t fieldRVA;
  offset_t offset;
  size_t thunkValSize;
  uint64_t thunkRva;
  bool isOk;
  bool is32;
  ImportedFuncWrapper *pIStack_18;
  FieldID fId_local;
  ImportedFuncWrapper *this_local;
  
  if ((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode ==
      (ExeNodeWrapper *)0x0) {
    this_local = (ImportedFuncWrapper *)0x0;
  }
  else {
    thunkRva._4_4_ = fId;
    pIStack_18 = this;
    thunkRva._3_1_ = ExeElementWrapper::isBit32((ExeElementWrapper *)this);
    thunkValSize = ExeElementWrapper::getNumValue
                             (&((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.
                                super_ExeNodeWrapper.parentNode)->super_ExeElementWrapper,
                              (long)thunkRva._4_4_,(bool *)((long)&thunkRva + 2));
    if ((thunkRva._2_1_ & 1) == 0) {
      this_local = (ImportedFuncWrapper *)0x0;
    }
    else {
      if ((thunkRva._3_1_ & 1) != 0) {
        thunkValSize = (size_t)(int)thunkValSize;
      }
      if ((thunkValSize == 0) || (thunkValSize == 0xffffffffffffffff)) {
        this_local = (ImportedFuncWrapper *)0x0;
      }
      else {
        bVar1 = ImportBaseFuncWrapper::getThunkValSize(&this->super_ImportBaseFuncWrapper);
        this_local = (ImportedFuncWrapper *)
                     (thunkValSize +
                     (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                     entryNum * bVar1);
      }
    }
  }
  return (offset_t)this_local;
}

Assistant:

offset_t ImportedFuncWrapper::getFieldRVA(ImportEntryWrapper::FieldID fId)
{
    if (!parentNode) return 0;
    bool is32 = isBit32();

    bool isOk;
    uint64_t thunkRva = parentNode->getNumValue(fId, &isOk);
    if (!isOk) return 0; //TODO

    if (is32) thunkRva = (int32_t)(thunkRva);
    if (thunkRva == 0 ||  thunkRva == (-1)) return 0; //TODO

    size_t thunkValSize = this->getThunkValSize();
    offset_t offset = this->entryNum * thunkValSize;

    offset_t fieldRVA = thunkRva + offset;
    return fieldRVA;
}